

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_http_request.cc
# Opt level: O3

int __thiscall AliHttpRequest::CommitRequest(AliHttpRequest *this)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  _Rb_tree_header *p_Var1;
  string *psVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  size_type sVar4;
  pointer pcVar5;
  int iVar6;
  iterator iVar7;
  mapped_type *pmVar8;
  _Base_ptr p_Var9;
  AliTlsConnection *this_01;
  long lVar10;
  AliTcpConnection *this_02;
  bool with_query;
  int iVar11;
  _Alloc_hider _Var12;
  _Self __tmp;
  string path;
  string req;
  string host;
  key_type local_f0;
  key_type local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b0;
  long local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  string local_90;
  long *local_70 [2];
  long local_60 [2];
  string local_50;
  
  iVar6 = std::__cxx11::string::compare((char *)&this->method_);
  with_query = true;
  if (iVar6 == 0) {
    paVar3 = &local_f0.field_2;
    local_f0._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"Content-Length","");
    this_00 = &this->map_request_headers_;
    iVar7 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&this_00->_M_t,&local_f0);
    sVar4 = (this->query_)._M_string_length;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != paVar3) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    if (sVar4 != 0 &&
        (_Rb_tree_header *)iVar7._M_node ==
        &(this->map_request_headers_)._M_t._M_impl.super__Rb_tree_header) {
      get_format_string_abi_cxx11_(&local_f0,"%d",(this->query_)._M_string_length);
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"Content-Length","");
      pmVar8 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](this_00,&local_d0);
      std::__cxx11::string::operator=((string *)pmVar8,(string *)&local_f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != paVar3) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
      local_f0._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"Content-Type","");
      pmVar8 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](this_00,&local_f0);
      std::__cxx11::string::_M_replace((ulong)pmVar8,0,(char *)pmVar8->_M_string_length,0x172788);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != paVar3) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
      with_query = false;
    }
  }
  GetPath_abi_cxx11_(&local_f0,this,with_query);
  get_format_string_abi_cxx11_
            (&local_d0,"%s %s HTTP/1.1\r\n",(this->method_)._M_dataplus._M_p,
             local_f0._M_dataplus._M_p);
  p_Var9 = (this->map_request_headers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->map_request_headers_)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var9 != p_Var1) {
    do {
      append_format_string
                (&local_d0,"%s: %s\r\n",*(undefined8 *)(p_Var9 + 1),*(undefined8 *)(p_Var9 + 2));
      p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
    } while ((_Rb_tree_header *)p_Var9 != p_Var1);
  }
  std::__cxx11::string::append((char *)&local_d0);
  if (this->is_tls == true) {
    this_01 = (AliTlsConnection *)operator_new(0xb08);
    pcVar5 = (this->host_)._M_dataplus._M_p;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar5,pcVar5 + (this->host_)._M_string_length);
    iVar6 = atoi((this->port_)._M_dataplus._M_p);
    AliTlsConnection::AliTlsConnection(this_01,&local_50,iVar6);
    this->connection_ = (AliConnection *)this_01;
    local_a0._M_allocated_capacity = local_50.field_2._M_allocated_capacity;
    _Var12._M_p = local_50._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == &local_50.field_2) goto LAB_0012d2bc;
  }
  else {
    local_b0 = &local_a0;
    pcVar5 = (this->host_)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,pcVar5,pcVar5 + (this->host_)._M_string_length);
    iVar6 = atoi((this->port_)._M_dataplus._M_p);
    if ((this->proxy_host_)._M_string_length != 0) {
      psVar2 = &this->proxy_host_;
      lVar10 = std::__cxx11::string::find((char *)psVar2,0x1727d1,0);
      if (lVar10 == -1) {
        iVar6 = 0x50;
        std::__cxx11::string::_M_assign((string *)&local_b0);
      }
      else {
        std::__cxx11::string::substr((ulong)local_70,(ulong)psVar2);
        std::__cxx11::string::operator=((string *)&local_b0,(string *)local_70);
        if (local_70[0] != local_60) {
          operator_delete(local_70[0],local_60[0] + 1);
        }
        std::__cxx11::string::substr((ulong)local_70,(ulong)psVar2);
        iVar6 = atoi((char *)local_70[0]);
        if (local_70[0] != local_60) {
          operator_delete(local_70[0],local_60[0] + 1);
        }
      }
    }
    this_02 = (AliTcpConnection *)operator_new(0x38);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,local_b0,local_b0->_M_local_buf + local_a8);
    AliTcpConnection::AliTcpConnection(this_02,&local_90,iVar6);
    this->connection_ = (AliConnection *)this_02;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    _Var12._M_p = (pointer)local_b0;
    if (local_b0 == &local_a0) goto LAB_0012d2bc;
  }
  operator_delete(_Var12._M_p,local_a0._M_allocated_capacity + 1);
LAB_0012d2bc:
  iVar6 = (**this->connection_->_vptr_AliConnection)();
  iVar11 = -1;
  if (((iVar6 == 0) &&
      (iVar6 = (*this->connection_->_vptr_AliConnection[1])
                         (this->connection_,local_d0._M_dataplus._M_p,
                          (ulong)(uint)local_d0._M_string_length), 0 < iVar6)) &&
     ((iVar6 = std::__cxx11::string::compare((char *)&this->method_), iVar6 != 0 ||
      (((this->query_)._M_string_length == 0 ||
       (iVar6 = (*this->connection_->_vptr_AliConnection[1])
                          (this->connection_,(this->query_)._M_dataplus._M_p), 0 < iVar6)))))) {
    iVar11 = 0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  return iVar11;
}

Assistant:

int AliHttpRequest::CommitRequest() {
  bool with_query = true;  

  // if content-length is not setted, we assume no body
  // put the query into body,and add Content-Type header
  if(this->method_ == "POST" 
     && this->map_request_headers_.find("Content-Length") == this->map_request_headers_.end()
     && this->query_.size() > 0) {
    with_query = false;
    this->map_request_headers_["Content-Length"] = get_format_string("%d", this->query_.size());
    this->map_request_headers_["Content-Type"] = "application/x-www-form-urlencoded";
  }
  std::string path = GetPath(with_query); 

  std::string req = get_format_string("%s %s HTTP/1.1\r\n", this->method_.c_str(),  path.c_str());
  for(std::map<std::string, std::string>::iterator it = map_request_headers_.begin();
      it != map_request_headers_.end(); it++) {
    append_format_string(req, "%s: %s\r\n", it->first.c_str(), it->second.c_str());
  }
  req.append("\r\n");

  ALI_LOG("request=\n%s", req.c_str());

  if(this->is_tls) {
    connection_ = new AliTlsConnection(this->host_, atoi(this->port_.c_str()));
  } else {
    std::string host = this->host_;
    int port = atoi(this->port_.c_str());
    if(!this->proxy_host_.empty()) {
        size_t pos = this->proxy_host_.find(":");
        if(pos == std::string::npos) {
          host = this->proxy_host_;
          port = 80;
        } else {
          host = this->proxy_host_.substr(0, pos);
          port = atoi(this->proxy_host_.substr(pos + 1, this->proxy_host_.size() - pos - 1).c_str());
        }
    }
    ALI_LOG("host=%s,port=%d", host.c_str(), port);
    connection_ = new AliTcpConnection(host, port);
  }

  if(connection_->Connect() != 0) {
    return -1;
  }

  if(connection_->Send((char*)req.c_str(), req.size()) <= 0) {
    return -1;
  }
  if(this->method_ == "POST" && this->query_.size() > 0) {
     if(connection_->Send((char*)this->query_.c_str(), this->query_.size()) <= 0) {
      return -1;
    }
  }
  return 0;
}